

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O3

void __thiscall
brotli::ZopfliCostModel::SetFromCommands
          (ZopfliCostModel *this,size_t num_bytes,size_t position,uint8_t *ringbuffer,
          size_t ringbuffer_mask,Command *commands,size_t num_commands,size_t last_insert_len)

{
  double dVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  pointer pdVar5;
  ulong uVar6;
  ulong uVar7;
  pointer __s;
  pointer __s_00;
  pointer __s_01;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  double dVar13;
  vector<double,_std::allocator<double>_> cost_literal;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  pointer local_58;
  size_t local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  local_50 = num_bytes;
  __s = (pointer)operator_new(0x400);
  local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s + 0x100;
  memset(__s,0,0x400);
  local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = __s + 0x100;
  __s_00 = (pointer)operator_new(0xb00);
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = __s_00;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s_00 + 0x2c0;
  memset(__s_00,0,0xb00);
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = __s_00 + 0x2c0;
  __s_01 = (pointer)operator_new(0x820);
  local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s_01 + 0x208;
  local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = __s_01;
  local_58 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  memset(__s_01,0,0x820);
  local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = local_58;
  if (num_commands != 0) {
    uVar8 = position - last_insert_len;
    sVar9 = 0;
    do {
      uVar12 = (ulong)commands[sVar9].insert_len_;
      uVar4 = commands[sVar9].copy_len_;
      uVar2 = commands[sVar9].dist_prefix_;
      uVar3 = commands[sVar9].cmd_prefix_;
      __s_00[uVar3] = __s_00[uVar3] + 1;
      uVar6 = uVar8;
      uVar7 = uVar12;
      if (0x7f < uVar3) {
        __s_01[uVar2] = __s_01[uVar2] + 1;
      }
      for (; uVar7 != 0; uVar7 = uVar7 - 1) {
        __s[ringbuffer[uVar6 & ringbuffer_mask]] = __s[ringbuffer[uVar6 & ringbuffer_mask]] + 1;
        uVar6 = uVar6 + 1;
      }
      uVar8 = uVar8 + uVar12 + (ulong)uVar4;
      sVar9 = sVar9 + 1;
    } while (sVar9 != num_commands);
  }
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Set(this,&local_70,&local_48);
  sVar9 = local_50;
  Set(this,&local_88,&this->cost_cmd_);
  Set(this,&local_a0,&this->cost_dist_);
  pdVar5 = (this->cost_cmd_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar13 = this->min_cost_cmd_;
  lVar10 = 0;
  do {
    dVar1 = pdVar5[lVar10];
    if (dVar13 <= dVar1) {
      dVar1 = dVar13;
    }
    dVar13 = dVar1;
    this->min_cost_cmd_ = dVar13;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x2c0);
  std::vector<double,_std::allocator<double>_>::resize(&this->literal_costs_,sVar9 + 1);
  pdVar5 = (this->literal_costs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar5 = 0.0;
  if (sVar9 == 0) {
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start == (pointer)0x0) goto LAB_00169d3c;
  }
  else {
    dVar13 = 0.0;
    sVar11 = 0;
    do {
      dVar13 = dVar13 + local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [ringbuffer[position + sVar11 & ringbuffer_mask]];
      pdVar5[sVar11 + 1] = dVar13;
      sVar11 = sVar11 + 1;
    } while (sVar9 != sVar11);
  }
  operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
LAB_00169d3c:
  if (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SetFromCommands(size_t num_bytes,
                       size_t position,
                       const uint8_t* ringbuffer,
                       size_t ringbuffer_mask,
                       const Command* commands,
                       size_t num_commands,
                       size_t last_insert_len) {
    std::vector<uint32_t> histogram_literal(256, 0);
    std::vector<uint32_t> histogram_cmd(kNumCommandPrefixes, 0);
    std::vector<uint32_t> histogram_dist(kNumDistancePrefixes, 0);

    size_t pos = position - last_insert_len;
    for (size_t i = 0; i < num_commands; i++) {
      size_t inslength = commands[i].insert_len_;
      size_t copylength = commands[i].copy_len_;
      size_t distcode = commands[i].dist_prefix_;
      size_t cmdcode = commands[i].cmd_prefix_;

      histogram_cmd[cmdcode]++;
      if (cmdcode >= 128) histogram_dist[distcode]++;

      for (size_t j = 0; j < inslength; j++) {
        histogram_literal[ringbuffer[(pos + j) & ringbuffer_mask]]++;
      }

      pos += inslength + copylength;
    }

    std::vector<double> cost_literal;
    Set(histogram_literal, &cost_literal);
    Set(histogram_cmd, &cost_cmd_);
    Set(histogram_dist, &cost_dist_);

    for (uint32_t i = 0; i < kNumCommandPrefixes; ++i) {
      min_cost_cmd_ = std::min(min_cost_cmd_, cost_cmd_[i]);
    }

    literal_costs_.resize(num_bytes + 1);
    literal_costs_[0] = 0.0;
    for (size_t i = 0; i < num_bytes; ++i) {
      literal_costs_[i + 1] = literal_costs_[i] +
          cost_literal[ringbuffer[(position + i) & ringbuffer_mask]];
    }
  }